

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall NodeSet::sort(NodeSet *this)

{
  pointer pvVar1;
  long lVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> *lbl;
  pointer pvVar6;
  
  std::
  _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::clear((_Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
           *)this);
  pvVar6 = (this->labels).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->labels).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar6 != pvVar1) {
    uVar4 = ((long)pvVar1 - (long)pvVar6 >> 3) * -0x5555555555555555;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar6,pvVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar6,pvVar1);
    pvVar6 = (this->labels).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (this->labels).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar6 != pvVar1) {
      iVar5 = 0;
      do {
        pmVar3 = std::
                 map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ::operator[](&this->index,pvVar6);
        *pmVar3 = iVar5;
        pvVar6 = pvVar6 + 1;
        iVar5 = iVar5 + 1;
      } while (pvVar6 != pvVar1);
    }
  }
  return;
}

Assistant:

void NodeSet::sort() {
	index.clear();
	std::sort(all(labels));
	int pos = 0;
	for (const std::vector<int> &lbl : labels) {
		index[lbl] = pos++;
	}
}